

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O1

char ** hts_idx_seqnames(hts_idx_t *idx,int *n,hts_id2name_f getid,void *hdr)

{
  char **ppcVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  
  iVar4 = 0;
  if ((long)idx->n == 0) {
    ppcVar1 = (char **)0x0;
  }
  else {
    ppcVar1 = (char **)calloc((long)idx->n,8);
    iVar4 = 0;
    if (0 < idx->n) {
      lVar5 = 0;
      iVar4 = 0;
      do {
        if (idx->bidx[lVar5] != (bidx_t *)0x0) {
          pcVar2 = (*getid)(hdr,(int)lVar5);
          lVar3 = (long)iVar4;
          iVar4 = iVar4 + 1;
          ppcVar1[lVar3] = pcVar2;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < idx->n);
    }
  }
  *n = iVar4;
  return ppcVar1;
}

Assistant:

const char **hts_idx_seqnames(const hts_idx_t *idx, int *n, hts_id2name_f getid, void *hdr)
{
    if ( !idx->n )
    {
        *n = 0;
        return NULL;
    }

    int tid = 0, i;
    const char **names = (const char**) calloc(idx->n,sizeof(const char*));
    for (i=0; i<idx->n; i++)
    {
        bidx_t *bidx = idx->bidx[i];
        if ( !bidx ) continue;
        names[tid++] = getid(hdr,i);
    }
    *n = tid;
    return names;
}